

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringlib.c
# Opt level: O3

stringlib_tokens_t * stringlib_splitTokens(char *str,char chr)

{
  char cVar1;
  stringlib_tokens_t *psVar2;
  stringlib_tokens_t *psVar3;
  stringlib_tokens_t *psVar4;
  stringlib_tokens_t *psVar5;
  stringlib_tokens_t *unaff_RBX;
  char *newPos;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  cVar1 = *str;
  if (cVar1 != '\0') {
    pcVar6 = str + 1;
    psVar4 = (stringlib_tokens_t *)0x0;
    pcVar7 = str;
    pcVar8 = str;
    do {
      psVar2 = unaff_RBX;
      psVar5 = psVar4;
      if (cVar1 == chr) {
        psVar2 = (stringlib_tokens_t *)malloc(0x18);
        psVar2->next = (s_stringlib_token *)0x0;
        psVar5 = psVar2;
        if (psVar4 != (stringlib_tokens_t *)0x0) {
          unaff_RBX->next = psVar2;
          psVar5 = psVar4;
        }
        psVar2->start = (long)pcVar8 - (long)str;
        psVar2->length = (long)pcVar7 - (long)pcVar8;
        pcVar8 = pcVar6;
      }
      cVar1 = *pcVar6;
      pcVar7 = pcVar7 + 1;
      pcVar6 = pcVar6 + 1;
      unaff_RBX = psVar2;
      psVar4 = psVar5;
    } while (cVar1 != '\0');
    psVar3 = (stringlib_tokens_t *)malloc(0x18);
    psVar3->next = (s_stringlib_token *)0x0;
    psVar4 = psVar3;
    if (psVar5 != (stringlib_tokens_t *)0x0) {
      psVar2->next = psVar3;
      psVar4 = psVar5;
    }
    psVar3->start = (long)pcVar8 - (long)str;
    psVar3->length = (long)pcVar7 - (long)pcVar8;
    return psVar4;
  }
  return (stringlib_tokens_t *)0x0;
}

Assistant:

stringlib_tokens_t *stringlib_splitTokens(char *str, char chr) {
	char *lastPos;
	char *newPos;

	stringlib_tokens_t *tokens = NULL;
	stringlib_tokens_t *currentToken;
	stringlib_tokens_t *newToken;

	newPos = str;
	lastPos = str;

	while ( *newPos != '\0' ) {
		if ( *newPos == chr ) {
			newToken = (stringlib_tokens_t *) malloc(sizeof(stringlib_tokens_t));
			newToken->next = NULL;

			if ( tokens == NULL ) {
				tokens = newToken;
				currentToken = newToken;
			} else {
				currentToken->next = newToken;
				currentToken = newToken;
			}

			currentToken->start = ( lastPos - str );
			currentToken->length = ( newPos - lastPos );
			lastPos = newPos + 1;
		}
		newPos++;
	}
	if ( newPos != str ) {
		newToken = (stringlib_tokens_t *) malloc(sizeof(stringlib_tokens_t));
		newToken->next = NULL;

		if ( tokens == NULL ) {
			tokens = newToken;
			currentToken = newToken;
		} else {
			currentToken->next = newToken;
			currentToken = newToken;
		}

		currentToken->start = ( lastPos - str );
		currentToken->length = ( newPos - lastPos );
	}
	return tokens;
}